

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# bitpackingaligned.cpp
# Opt level: O1

uint32_t * FastPForLib::__fastunpack26_8(uint32_t *in,uint32_t *out)

{
  uint uVar1;
  uint uVar2;
  uint uVar3;
  
  uVar1 = *in;
  uVar2 = in[1];
  *out = uVar1 & 0x3ffffff;
  out[1] = uVar1 >> 0x1a;
  out[1] = uVar1 >> 0x1a | (uVar2 & 0xfffff) << 6;
  uVar1 = in[2];
  out[2] = uVar2 >> 0x14;
  out[2] = uVar2 >> 0x14 | (uVar1 & 0x3fff) << 0xc;
  out[3] = uVar1 >> 0xe;
  uVar2 = in[3];
  uVar3 = in[4];
  out[3] = uVar1 >> 0xe | (uVar2 & 0xff) << 0x12;
  out[4] = uVar2 >> 8;
  out[4] = uVar2 >> 8 | (uVar3 & 3) << 0x18;
  out[5] = uVar3 >> 2 & 0x3ffffff;
  out[6] = uVar3 >> 0x1c;
  uVar1 = in[5];
  out[6] = uVar3 >> 0x1c | (uVar1 & 0x3fffff) << 4;
  uVar2 = in[6];
  out[7] = uVar1 >> 0x16;
  out[7] = (uVar2 & 0xffff) << 10 | uVar1 >> 0x16;
  return in + 7;
}

Assistant:

const uint32_t *__fastunpack26_8(const uint32_t *__restrict__ in,
                                 uint32_t *__restrict__ out) {

  *out = ((*in) >> 0) % (1U << 26);
  out++;
  *out = ((*in) >> 26);
  ++in;
  *out |= ((*in) % (1U << 20)) << (26 - 20);
  out++;
  *out = ((*in) >> 20);
  ++in;
  *out |= ((*in) % (1U << 14)) << (26 - 14);
  out++;
  *out = ((*in) >> 14);
  ++in;
  *out |= ((*in) % (1U << 8)) << (26 - 8);
  out++;
  *out = ((*in) >> 8);
  ++in;
  *out |= ((*in) % (1U << 2)) << (26 - 2);
  out++;
  *out = ((*in) >> 2) % (1U << 26);
  out++;
  *out = ((*in) >> 28);
  ++in;
  *out |= ((*in) % (1U << 22)) << (26 - 22);
  out++;
  *out = ((*in) >> 22);
  ++in;
  *out |= ((*in) % (1U << 16)) << (26 - 16);
  out++;

  return in + 1;
}